

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

int __thiscall FixedSizeCache<int>::at(FixedSizeCache<int> *this,int index)

{
  pointer piVar1;
  runtime_error *this_00;
  
  if (this->_count <= index) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"FixedSizeCache index out-of-range");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar1 = (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(long)index <
      (ulong)((long)(this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
    return piVar1[index];
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

T
    at(int const index) const
    {
        if (index >= this->_count) throw std::runtime_error("FixedSizeCache index out-of-range");
        return this->_data.at(index);
    }